

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O0

FT_UInt32 ps_unicodes_char_next(PS_Unicodes table,FT_UInt32 *unicode)

{
  FT_UInt FVar1;
  uint uVar2;
  PS_UniMap *pPVar3;
  FT_UInt32 base_glyph;
  PS_UniMap *map;
  uint local_28;
  FT_UInt mid;
  FT_UInt max;
  FT_UInt min;
  FT_UInt32 char_code;
  FT_UInt result;
  FT_UInt32 *unicode_local;
  PS_Unicodes table_local;
  
  min = 0;
  max = *unicode + 1;
  mid = 0;
  FVar1 = table->num_maps;
  do {
    local_28 = FVar1;
    if (local_28 <= mid) {
      if ((min == 0) && (max = 0, mid < table->num_maps)) {
        min = table->maps[mid].glyph_index;
        max = table->maps[mid].unicode & 0x7fffffff;
      }
LAB_00318075:
      *unicode = max;
      return min;
    }
    FVar1 = mid + (local_28 - mid >> 1);
    pPVar3 = table->maps + FVar1;
    if (pPVar3->unicode == max) {
      min = pPVar3->glyph_index;
      goto LAB_00318075;
    }
    uVar2 = pPVar3->unicode & 0x7fffffff;
    if (uVar2 == max) {
      min = pPVar3->glyph_index;
    }
    if (uVar2 < max) {
      mid = FVar1 + 1;
      FVar1 = local_28;
    }
  } while( true );
}

Assistant:

static FT_UInt32
  ps_unicodes_char_next( PS_Unicodes  table,
                         FT_UInt32   *unicode )
  {
    FT_UInt    result    = 0;
    FT_UInt32  char_code = *unicode + 1;


    {
      FT_UInt     min = 0;
      FT_UInt     max = table->num_maps;
      FT_UInt     mid;
      PS_UniMap*  map;
      FT_UInt32   base_glyph;


      while ( min < max )
      {
        mid = min + ( ( max - min ) >> 1 );
        map = table->maps + mid;

        if ( map->unicode == char_code )
        {
          result = map->glyph_index;
          goto Exit;
        }

        base_glyph = BASE_GLYPH( map->unicode );

        if ( base_glyph == char_code )
          result = map->glyph_index;

        if ( base_glyph < char_code )
          min = mid + 1;
        else
          max = mid;
      }

      if ( result )
        goto Exit;               /* we have a variant glyph */

      /* we didn't find it; check whether we have a map just above it */
      char_code = 0;

      if ( min < table->num_maps )
      {
        map       = table->maps + min;
        result    = map->glyph_index;
        char_code = BASE_GLYPH( map->unicode );
      }
    }

  Exit:
    *unicode = char_code;
    return result;
  }